

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

void * __thiscall rcg::Buffer::getBase(Buffer *this,uint32_t part)

{
  void *pvVar1;
  void *stream;
  unsigned_long uVar2;
  size_t size;
  void *ret;
  INFO_DATATYPE type;
  
  if (this->multipart == true) {
    pvVar1 = Stream::getHandle(this->parent);
    ret = (void *)0x0;
    size = 8;
    if (this->buffer == (BUFFER_HANDLE)0x0 || pvVar1 == (void *)0x0) {
      ret = (void *)0x0;
    }
    else {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSGetBufferPartInfo)(pvVar1,this->buffer,part,0,&type,&ret,&size);
    }
  }
  else {
    pvVar1 = Stream::getHandle(this->parent);
    pvVar1 = (anonymous_namespace)::getBufferValue<void*>(&this->gentl,pvVar1,this->buffer,0);
    stream = Stream::getHandle(this->parent);
    uVar2 = anon_unknown_6::getBufferValue<unsigned_long>(&this->gentl,stream,this->buffer,0x12);
    ret = (void *)(uVar2 + (long)pvVar1);
  }
  return ret;
}

Assistant:

void *Buffer::getBase(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<void *>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_BASE);
  }
  else
  {
    void *ret=getBufferValue<void *>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_BASE);

    size_t offset=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                         GenTL::BUFFER_INFO_IMAGEOFFSET);

    if (offset > 0)
    {
      ret=reinterpret_cast<char *>(ret)+offset;
    }

    return ret;
  }
}